

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O3

int hash_find(HashTable *table,void *key,void **_value)

{
  void *pvVar1;
  HashItem **ppHVar2;
  uint32 uVar3;
  int iVar4;
  HashItem *pHVar5;
  uint uVar6;
  HashItem *pHVar7;
  
  pvVar1 = table->data;
  uVar3 = (*table->hash)(key,pvVar1);
  uVar6 = table->table_len - 1 & uVar3;
  pHVar7 = table->table[uVar6];
  if (pHVar7 == (HashItem *)0x0) {
LAB_0011f519:
    iVar4 = 0;
  }
  else {
    iVar4 = (*table->keymatch)(key,pHVar7->key,pvVar1);
    if (iVar4 == 0) {
      do {
        pHVar5 = pHVar7;
        pHVar7 = pHVar5->next;
        if (pHVar7 == (HashItem *)0x0) goto LAB_0011f519;
        iVar4 = (*table->keymatch)(key,pHVar7->key,pvVar1);
      } while (iVar4 == 0);
    }
    else {
      pHVar5 = (HashItem *)0x0;
    }
    if (_value != (void **)0x0) {
      *_value = pHVar7->value;
    }
    iVar4 = 1;
    if ((pHVar5 != (HashItem *)0x0) && (table->stackable == 0)) {
      if (pHVar5->next != pHVar7) {
        __assert_fail("prev->next == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                      ,0x41,"int hash_find(const HashTable *, const void *, const void **)");
      }
      pHVar5->next = pHVar7->next;
      ppHVar2 = table->table;
      pHVar7->next = ppHVar2[uVar6];
      ppHVar2[uVar6] = pHVar7;
    }
  }
  return iVar4;
}

Assistant:

int hash_find(const HashTable *table, const void *key, const void **_value)
{
    HashItem *i;
    void *data = table->data;
    const uint32 hash = calc_hash(table, key);
    HashItem *prev = NULL;
    for (i = table->table[hash]; i != NULL; i = i->next)
    {
        if (table->keymatch(key, i->key, data))
        {
            if (_value != NULL)
                *_value = i->value;

            // Matched! Move to the front of list for faster lookup next time.
            //  (stackable tables have to remain in the same order, though!)
            if ((!table->stackable) && (prev != NULL))
            {
                assert(prev->next == i);
                prev->next = i->next;
                i->next = table->table[hash];
                table->table[hash] = i;
            } // if

            return 1;
        } // if

        prev = i;
    } // for

    return 0;
}